

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

char * fy_token_get_text0(fy_token *fyt)

{
  fy_token *fyt_local;
  
  if (fyt == (fy_token *)0x0) {
    fyt_local = (fy_token *)0x17d585;
  }
  else {
    if (fyt->text0 == (char *)0x0) {
      fy_token_prepare_text(fyt);
    }
    fyt_local = (fy_token *)fyt->text0;
  }
  return (char *)fyt_local;
}

Assistant:

const char *fy_token_get_text0(struct fy_token *fyt) {
    /* return empty */
    if (!fyt)
        return "";

    /* created text is always zero terminated */
    if (!fyt->text0)
        fy_token_prepare_text(fyt);

    return fyt->text0;
}